

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O1

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
          (S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p,EdgeVisitor *visitor)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int32 iVar6;
  bool bVar7;
  int iVar8;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference pvVar9;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  long lVar12;
  ulong uVar13;
  size_type_conflict n;
  Edge edge;
  double local_98;
  VType aVStack_90 [2];
  double dStack_80;
  VType local_78 [2];
  ShapeEdge local_68;
  long *plVar10;
  
  bVar7 = S2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar7) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(&this->it_);
    uVar4 = *(uint *)this_00;
    bVar7 = (uVar4 & 0xffffff) == 0;
    if (!bVar7) {
      n = 0;
LAB_001a5b67:
      pvVar9 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         (this_00,n);
      uVar5 = *(uint *)&pvVar9->field_0x4;
      bVar7 = false;
      if (1 < uVar5) {
        iVar8 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)pvVar9->shape_id_);
        plVar10 = (long *)CONCAT44(extraout_var,iVar8);
        uVar13 = 0;
LAB_001a5bb2:
        paVar11 = &pvVar9->field_3;
        if (5 < *(uint *)&pvVar9->field_0x4) {
          paVar11 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar9->field_3).edges_;
        }
        iVar6 = *(int32 *)((long)paVar11 + uVar13 * 4);
        (**(code **)(*plVar10 + 0x18))(&local_98,plVar10,iVar6);
        dVar3 = p->c_[0];
        if ((local_98 == dVar3) && (!NAN(local_98) && !NAN(dVar3))) {
          lVar12 = 0;
          do {
            if (lVar12 == 0x10) goto LAB_001a5c33;
            pdVar1 = (double *)((long)aVStack_90 + lVar12);
            pdVar2 = (double *)((long)p->c_ + lVar12 + 8);
            lVar12 = lVar12 + 8;
          } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
        }
        if ((dStack_80 == dVar3) && (!NAN(dStack_80) && !NAN(dVar3))) {
          lVar12 = 0;
          do {
            if (lVar12 == 0x10) goto LAB_001a5c33;
            pdVar1 = (double *)((long)local_78 + lVar12);
            pdVar2 = (double *)((long)p->c_ + lVar12 + 8);
            lVar12 = lVar12 + 8;
          } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
        }
        goto LAB_001a5c7a;
      }
      goto LAB_001a5c9f;
    }
  }
  else {
LAB_001a5caf:
    bVar7 = true;
  }
  return bVar7;
LAB_001a5c33:
  local_68.id_.shape_id = (int32)plVar10[1];
  local_68.edge_.v1.c_[1] = local_78[0];
  local_68.edge_.v1.c_[2] = local_78[1];
  local_68.edge_.v0.c_[2] = aVStack_90[1];
  local_68.edge_.v1.c_[0] = dStack_80;
  local_68.edge_.v0.c_[0] = local_98;
  local_68.edge_.v0.c_[1] = aVStack_90[0];
  local_68.id_.edge_id = iVar6;
  if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar7 = (*visitor->_M_invoker)((_Any_data *)visitor,&local_68);
  if (!bVar7) {
    bVar7 = true;
    goto LAB_001a5c9f;
  }
LAB_001a5c7a:
  uVar13 = uVar13 + 1;
  if (uVar13 == uVar5 >> 1) goto code_r0x001a5c88;
  goto LAB_001a5bb2;
code_r0x001a5c88:
  bVar7 = false;
LAB_001a5c9f:
  if (bVar7) {
    return false;
  }
  n = n + 1;
  if (n == (uVar4 & 0xffffff)) goto LAB_001a5caf;
  goto LAB_001a5b67;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitIncidentEdges(
    const S2Point& p, const EdgeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int num_edges = clipped.num_edges();
    if (num_edges == 0) continue;
    const S2Shape& shape = *index_->shape(clipped.shape_id());
    for (int i = 0; i < num_edges; ++i) {
      int edge_id = clipped.edge(i);
      auto edge = shape.edge(edge_id);
      if ((edge.v0 == p || edge.v1 == p) &&
          !visitor(s2shapeutil::ShapeEdge(shape.id(), edge_id, edge))) {
        return false;
      }
    }
  }
  return true;
}